

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O0

bool __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::evaluateExpression
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          QExpression *left,QExpression *right,QOperation oper)

{
  bool bVar1;
  QExpression *pQVar2;
  bool local_42;
  bool local_41;
  QOperation oper_local;
  QExpression *right_local;
  QExpression *left_local;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this_local;
  
  switch(oper) {
  case Or:
    bVar1 = QExpression::operator>(left,0);
    local_42 = true;
    if (!bVar1) {
      local_42 = QExpression::operator>(right,0);
    }
    *(ulong *)&left->field_0 = (ulong)local_42;
    left->Type = NaturalNumber;
    break;
  case And:
    bVar1 = QExpression::operator>(left,0);
    local_41 = false;
    if (bVar1) {
      local_41 = QExpression::operator>(right,0);
    }
    *(ulong *)&left->field_0 = (ulong)local_41;
    left->Type = NaturalNumber;
    break;
  case Equal:
    bVar1 = isEqual(this,left,right);
    if (!bVar1) {
      return false;
    }
    break;
  case NotEqual:
    bVar1 = isEqual(this,left,right);
    if (!bVar1) {
      return false;
    }
    (left->field_0).SubExpressions.storage_ =
         (QExpression *)((ulong)(left->field_0).SubExpressions.storage_ ^ 1);
    break;
  case GreaterOrEqual:
    bVar1 = QExpression::operator>=(left,right);
    *(ulong *)&left->field_0 = (ulong)bVar1;
    left->Type = NaturalNumber;
    break;
  case LessOrEqual:
    bVar1 = QExpression::operator<=(left,right);
    *(ulong *)&left->field_0 = (ulong)bVar1;
    left->Type = NaturalNumber;
    break;
  case Greater:
    bVar1 = QExpression::operator>(left,right);
    *(ulong *)&left->field_0 = (ulong)bVar1;
    left->Type = NaturalNumber;
    break;
  case Less:
    bVar1 = QExpression::operator<(left,right);
    *(ulong *)&left->field_0 = (ulong)bVar1;
    left->Type = NaturalNumber;
    break;
  case BitwiseOr:
    QExpression::operator|=(left,right);
    break;
  case BitwiseAnd:
    QExpression::operator&=(left,right);
    break;
  case Addition:
    QExpression::operator+=(left,right);
    break;
  case Subtraction:
    QExpression::operator-=(left,right);
    break;
  case Multiplication:
    QExpression::operator*=(left,right);
    break;
  case Division:
    bVar1 = QExpression::operator!=(right,0);
    if (!bVar1) {
      return false;
    }
    QExpression::operator/=(left,right);
    break;
  case Remainder:
    pQVar2 = (QExpression *)QExpression::operator%(left,right);
    (left->field_0).SubExpressions.storage_ = pQVar2;
    left->Type = IntegerNumber;
    break;
  case Exponent:
    bVar1 = QExpression::operator^=(left,right);
    return bVar1;
  }
  return true;
}

Assistant:

bool evaluateExpression(QExpression &left, QExpression &right, const QOperation oper) const noexcept {
        switch (oper) {
            case QOperation::Exponent: { // ^
                return (left ^= right);
            }

            case QOperation::Remainder: { // %
                left.Value.Number.Integer = (left % right);
                left.Type                 = ExpressionType::IntegerNumber;
                break;
            }

            case QOperation::Multiplication: { // *
                left *= right;
                break;
            }

            case QOperation::Division: { // /
                if (right != 0ULL) {
                    left /= right;
                    break;
                }

                return false;
            }

            case QOperation::Addition: { // +
                left += right;
                break;
            }

            case QOperation::Subtraction: { // -
                left -= right;
                break;
            }

            case QOperation::BitwiseAnd: { // &
                left &= right;
                break;
            }

            case QOperation::BitwiseOr: { // |
                left |= right;
                break;
            }

            case QOperation::Less: { // <
                left.Value.Number.Natural = SizeT64(left < right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::LessOrEqual: { // <=
                left.Value.Number.Natural = SizeT64(left <= right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::Greater: { // >
                left.Value.Number.Natural = SizeT64(left > right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::GreaterOrEqual: { // >=
                left.Value.Number.Natural = SizeT64(left >= right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::And: { // &&
                left.Value.Number.Natural = SizeT64((left > 0U) && (right > 0U));
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::Or: { // ||
                left.Value.Number.Natural = SizeT64((left > 0U) || (right > 0U));
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::Equal: { // ==
                if (isEqual(left, right)) {
                    break;
                }

                return false;
            }

            case QOperation::NotEqual: { // !=
                if (isEqual(left, right)) {
                    left.Value.Number.Natural = (left.Value.Number.Natural ^ 1ULL);
                    break;
                }

                return false;
            }

            default: {
                // It will not reach this.
            }
        }

        return true;
    }